

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExporter.cpp
# Opt level: O0

void __thiscall iDynTree::ModelExporter::ModelExporter(ModelExporter *this)

{
  void *__s;
  pointer pPVar1;
  unique_ptr<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
  *in_RDI;
  pointer in_stack_ffffffffffffffb8;
  Pimpl *this_00;
  
  this_00 = (Pimpl *)0x198;
  __s = operator_new(0x198);
  memset(__s,0,(size_t)this_00);
  Pimpl::Pimpl(this_00);
  std::
  unique_ptr<iDynTree::ModelExporter::Pimpl,std::default_delete<iDynTree::ModelExporter::Pimpl>>::
  unique_ptr<std::default_delete<iDynTree::ModelExporter::Pimpl>,void>
            (in_RDI,in_stack_ffffffffffffffb8);
  pPVar1 = std::
           unique_ptr<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
           ::operator->((unique_ptr<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
                         *)0x18b298);
  pPVar1->m_isModelValid = false;
  return;
}

Assistant:

ModelExporter::ModelExporter()
: m_pimpl(new Pimpl())
{
    m_pimpl->m_isModelValid = false;
}